

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersTests.cpp
# Opt level: O1

bool deqp::egl::anon_unknown_4::checkColor(TestLog *log,TextureLevel *screen,Vec4 *color)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  int i;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ConstPixelBufferAccess *__return_storage_ptr__;
  void *__buf;
  int iVar7;
  bool bVar8;
  float fVar9;
  Vec4 diff;
  Vec4 pixel;
  Vec4 threshold;
  Vector<bool,_4> res_1;
  string local_250;
  string local_230;
  TextureLevel *local_210;
  float local_208 [4];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [24];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  ios_base local_160 [264];
  ConstPixelBufferAccess local_58;
  
  local_1f8._16_4_ = 0x3c23d70a;
  local_1f8._20_4_ = 0x3c23d70a;
  local_1f8._24_4_ = 0x3c23d70a;
  local_1f8._28_4_ = 0x3f800000;
  iVar4 = (screen->m_size).m_data[1];
  bVar3 = iVar4 < 1;
  if (0 < iVar4) {
    iVar4 = 0;
    __return_storage_ptr__ = &local_58;
    local_210 = screen;
    do {
      if (0 < (screen->m_size).m_data[0]) {
        iVar7 = 0;
        do {
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1d8,screen);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1f8,(int)(ConstPixelBufferAccess *)local_1d8,
                     iVar7,iVar4);
          local_1d8._0_4_ = R;
          local_1d8._4_4_ = SNORM_INT8;
          auStack_1d0._0_8_ = (_func_int **)0x0;
          lVar5 = 0;
          do {
            *(float *)(local_1d8 + lVar5 * 4) =
                 *(float *)(local_1f8 + lVar5 * 4) - color->m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_208[0] = 0.0;
          local_208[1] = 0.0;
          local_208[2] = 0.0;
          local_208[3] = 0.0;
          lVar5 = 0;
          do {
            fVar1 = *(float *)(local_1d8 + lVar5 * 4);
            fVar9 = -fVar1;
            if (-fVar1 <= fVar1) {
              fVar9 = fVar1;
            }
            local_208[lVar5] = fVar9;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_1d8 = (undefined1  [8])((ulong)local_1d8 & 0xffffffff00000000);
          lVar5 = 0;
          do {
            local_1d8[lVar5] = local_208[lVar5] <= *(float *)(local_1f8 + lVar5 * 4 + 0x10);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          if (local_1d8[0] == R) {
            bVar8 = false;
          }
          else {
            uVar2 = 0;
            do {
              uVar6 = uVar2;
              if (uVar6 == 3) break;
              uVar2 = uVar6 + 1;
            } while (local_1d8[uVar6 + 1] != '\0');
            bVar8 = 2 < uVar6;
          }
          if (!bVar8) {
            local_1d8 = (undefined1  [8])log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_1d0,"Unexpected color values read from screen expected: ",
                       0x33);
            tcu::operator<<((ostream *)auStack_1d0,color);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1d0);
            std::ios_base::~ios_base(local_160);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Screen","");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Screen","");
            tcu::TextureLevel::getAccess(__return_storage_ptr__,local_210);
            tcu::LogImage::LogImage
                      ((LogImage *)local_1d8,&local_230,&local_250,__return_storage_ptr__,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write
                      ((LogImage *)local_1d8,(int)log,__buf,(size_t)__return_storage_ptr__);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_p != local_1a8) {
              operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
            }
            if (local_1d8 != (undefined1  [8])((long)auStack_1d0 + 8)) {
              operator_delete((void *)local_1d8,auStack_1d0._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p == &local_230.field_2) {
              return bVar3;
            }
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
            return bVar3;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < (screen->m_size).m_data[0]);
      }
      iVar4 = iVar4 + 1;
      iVar7 = (screen->m_size).m_data[1];
      bVar3 = iVar7 <= iVar4;
    } while (iVar4 < iVar7);
  }
  return bVar3;
}

Assistant:

bool checkColor (tcu::TestLog& log, const tcu::TextureLevel& screen, const tcu::Vec4& color)
{
	const tcu::Vec4 threshold(0.01f, 0.01f, 0.01f, 1.00f);

	for (int y = 0; y < screen.getHeight(); y++)
	{
		for (int x = 0; x < screen.getWidth(); x++)
		{
			const tcu::Vec4	pixel(screen.getAccess().getPixel(x, y));
			const tcu::Vec4	diff(abs(pixel - color));

			if (!boolAll(lessThanEqual(diff, threshold)))
			{
				log << TestLog::Message << "Unexpected color values read from screen expected: " << color << TestLog::EndMessage;
				log << TestLog::Image("Screen", "Screen", screen.getAccess());
				return false;
			}
		}
	}

	return true;
}